

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

char * ExportLabelToSld(char *naam,SLabelTableEntry *label)

{
  char *__src;
  char cVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  EType EVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  char *p;
  char *__s2;
  bool bVar11;
  bool bVar12;
  
  if (label == (SLabelTableEntry *)0x0) {
    __assert_fail("nullptr != label",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/tables.cpp"
                  ,0x7e,"char *ExportLabelToSld(const char *, const SLabelTableEntry *)");
  }
  cVar1 = *naam;
  p = naam + (cVar1 == '!');
  bVar11 = false;
  if ((cVar1 == '@') && (bVar11 = false, macrolabp != (char *)0x0)) {
    bVar11 = naam[1] == '.';
    if (bVar11) {
      p = naam + 1;
    }
  }
  bVar5 = isLabelStart(p,true);
  if (bVar5) {
    cVar2 = *p;
    __src = p + 1;
    bVar5 = cVar2 == '.';
    if (bVar5) {
      p = __src;
    }
    if (cVar2 == '@') {
      p = __src;
    }
    bVar3 = (!bVar11 && bVar5) && macrolabp != (char *)0x0;
    bVar12 = false;
    if (((bVar11 || !bVar5) || macrolabp == (char *)0x0) && (bVar12 = false, cVar2 != '@')) {
      bVar12 = ModuleName[0] != '\0';
    }
    uVar8 = label->traits;
    sldLabelExport[0] = '\0';
    if (bVar12) {
      strncat(sldLabelExport,ModuleName,0x800);
    }
    sVar9 = strlen(sldLabelExport);
    pcVar4 = vorlabp;
    pcVar10 = vorlabp;
    if (bVar3) {
      pcVar10 = macrolabp;
    }
    __s2 = p;
    if (cVar2 == '.') {
      __s2 = pcVar10;
    }
    if ((uVar8 & 0x18) == 0) {
      __s2 = pcVar10;
    }
    (sldLabelExport + sVar9)[0] = ',';
    (sldLabelExport + sVar9)[1] = '\0';
    if (cVar1 == '!') {
      __s2 = p;
    }
    if ((pcVar4 == __s2) && (ModuleName[0] != '\0')) {
      sVar9 = strlen(ModuleName);
      iVar6 = strncmp(ModuleName,__s2,sVar9);
      if (iVar6 == 0) {
        __s2 = __s2 + sVar9 + 1;
      }
    }
    strncat(sldLabelExport,__s2,0x40);
    sVar9 = strlen(sldLabelExport);
    (sldLabelExport + sVar9)[0] = ',';
    (sldLabelExport + sVar9)[1] = '\0';
    if (cVar2 == '.') {
      strncat(sldLabelExport,__src,0x40);
    }
    if ((label->traits & 4) != 0) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+eq",4);
      (sldLabelExport + sVar9 + 4)[0] = 'u';
      (sldLabelExport + sVar9 + 4)[1] = '\0';
    }
    if (bVar3) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+macro",8);
    }
    if ((label->traits & 0x80) != 0) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+sm",4);
      (sldLabelExport + sVar9 + 4)[0] = 'c';
      (sldLabelExport + sVar9 + 4)[1] = '\0';
    }
    EVar7 = label->isRelocatable;
    if (EVar7 == REGULAR) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+reloc",8);
      EVar7 = label->isRelocatable;
    }
    if (EVar7 == HIGH) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+reloc_",8);
      builtin_strncpy(sldLabelExport + sVar9 + 5,"oc_high",8);
    }
    if (label->used == true) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+us",4);
      builtin_strncpy(sldLabelExport + sVar9 + 3,"sed",4);
    }
    uVar8 = label->traits;
    if ((uVar8 & 8) != 0) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+struct",8);
      builtin_strncpy(sldLabelExport + sVar9 + 5,"uct_def",8);
      uVar8 = label->traits;
    }
    if ((uVar8 & 0x10) != 0) {
      sVar9 = strlen(sldLabelExport);
      builtin_strncpy(sldLabelExport + sVar9,",+struct",8);
      builtin_strncpy(sldLabelExport + sVar9 + 6,"ct_data",8);
    }
    return sldLabelExport;
  }
  __assert_fail("isLabelStart(naam)",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/tables.cpp"
                ,0x85,"char *ExportLabelToSld(const char *, const SLabelTableEntry *)");
}

Assistant:

char* ExportLabelToSld(const char* naam, const SLabelTableEntry* label) {
	// does re-parse the original source line again similarly to ValidateLabel
	// but prepares SLD 'L'-type line, with module/main/local comma separated + usage traits info
	assert(nullptr != label);
	// check if this is setting namespace
	bool setNameSpace = ('!' != *naam);
	if (!setNameSpace) ++naam;
	// check if local label defined inside macro wants to become non-macro local label
	const bool escMacro = setNameSpace && macrolabp && ('@' == naam[0]) && ('.' == naam[1]);
	if (escMacro) ++naam;			// such extra "@" is consumed right here and only '.' is left
	assert(isLabelStart(naam));		// this should be called only when ValidateLabel did succeed
	const bool global = '@' == *naam;
	const bool local = '.' == *naam;
	if (global || local) ++naam;	// single modifier is parsed
	const bool inMacro = !escMacro && local && macrolabp;
	const bool inModule = !inMacro && !global && ModuleName[0];
	const bool isStructLabel = (label->traits & (LABEL_IS_STRUCT_D|LABEL_IS_STRUCT_E));
	// build fully qualified SLD info
	sldLabelExport[0] = 0;
	// module part
	if (inModule) STRCAT(sldLabelExport, LINEMAX, ModuleName);
	STRCAT(sldLabelExport, 2, ",");
	// main label part (the `vorlabp` is already the current label, if it was main label)
	// except for structure labels: the inner ones don't "set namespace" == vorlabp, use "naam" then
	// (but only if the main label of structure itself is not local, if it's local, use vorlabp)
	const char* mainLabel = isStructLabel && !local ? naam : inMacro ? macrolabp : vorlabp;
	if (!setNameSpace) mainLabel = naam;
	if (vorlabp == mainLabel && ModuleName[0]) {	// vorlabp now contains also module part, skip it
		auto modNameSz = strlen(ModuleName);
		if (0 == strncmp(ModuleName, mainLabel, modNameSz)) mainLabel += modNameSz + 1;
	}
	STRCAT(sldLabelExport, LABMAX, mainLabel);
	STRCAT(sldLabelExport, 2, ",");
	// local part
	if (local) STRCAT(sldLabelExport, LABMAX, naam);
	// usage traits
	if (label->traits&LABEL_IS_EQU) STRCAT(sldLabelExport, 20, ",+equ");
	if (inMacro) STRCAT(sldLabelExport, 20, ",+macro");
	if (label->traits&LABEL_IS_SMC) STRCAT(sldLabelExport, 20, ",+smc");
	if (Relocation::REGULAR == label->isRelocatable) STRCAT(sldLabelExport, 20, ",+reloc");
	if (Relocation::HIGH == label->isRelocatable) STRCAT(sldLabelExport, 20, ",+reloc_high");
	if (label->used) STRCAT(sldLabelExport, 20, ",+used");
	if (label->traits&LABEL_IS_STRUCT_D) STRCAT(sldLabelExport, 20, ",+struct_def");
	if (label->traits&LABEL_IS_STRUCT_E) STRCAT(sldLabelExport, 20, ",+struct_data");
	return sldLabelExport;
}